

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O1

void __thiscall
slang::syntax::SimplePathSuffixSyntax::SimplePathSuffixSyntax
          (SimplePathSuffixSyntax *this,SeparatedSyntaxList<slang::syntax::NameSyntax> *outputs)

{
  size_type sVar1;
  SyntaxKind SVar2;
  undefined4 uVar3;
  NameSyntax *pNVar4;
  ulong uVar5;
  size_t index;
  
  (this->super_PathSuffixSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_PathSuffixSyntax).super_SyntaxNode.kind = SimplePathSuffix;
  SVar2 = (outputs->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar3 = *(undefined4 *)&(outputs->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->outputs).super_SyntaxListBase.super_SyntaxNode.parent =
       (outputs->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->outputs).super_SyntaxListBase.super_SyntaxNode.kind = SVar2;
  *(undefined4 *)&(this->outputs).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar3;
  (this->outputs).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (this->outputs).super_SyntaxListBase.childCount = (outputs->super_SyntaxListBase).childCount;
  (this->outputs).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_004ece40;
  sVar1 = (outputs->elements).size_;
  (this->outputs).elements.data_ = (outputs->elements).data_;
  (this->outputs).elements.size_ = sVar1;
  (this->outputs).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  uVar5 = (this->outputs).elements.size_ + 1;
  if (1 < uVar5) {
    index = 0;
    do {
      pNVar4 = SeparatedSyntaxList<slang::syntax::NameSyntax>::operator[](&this->outputs,index);
      (pNVar4->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
      index = index + 1;
    } while (uVar5 >> 1 != index);
  }
  return;
}

Assistant:

struct SLANG_EXPORT NamedLabelSyntax : public SyntaxNode {
    Token name;
    Token colon;

    NamedLabelSyntax(Token name, Token colon) :
        SyntaxNode(SyntaxKind::NamedLabel), name(name), colon(colon) {
    }

    explicit NamedLabelSyntax(const NamedLabelSyntax&) = default;

    static bool isKind(SyntaxKind kind);

    TokenOrSyntax getChild(size_t index);
    ConstTokenOrSyntax getChild(size_t index) const;
    void setChild(size_t index, TokenOrSyntax child);

}